

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O0

void __thiscall Environment::Environment(Environment *this,Environment *other)

{
  bool bVar1;
  reference __k;
  mapped_type *pmVar2;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  ptr<Function> function;
  ptr<Member> member;
  value_type *it;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<Symbol,_std::shared_ptr<Member>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>_>
  *__range1;
  Environment *other_local;
  Environment *this_local;
  
  std::
  unordered_map<Symbol,_std::shared_ptr<Member>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>_>
  ::unordered_map(&this->symbols);
  __end1 = std::
           unordered_map<Symbol,_std::shared_ptr<Member>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>_>
           ::begin(&other->symbols);
  it = (value_type *)
       std::
       unordered_map<Symbol,_std::shared_ptr<Member>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>_>
       ::end(&other->symbols);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_Symbol,_std::shared_ptr<Member>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Symbol,_std::shared_ptr<Member>_>,_true>
                         *)&it);
    if (!bVar1) break;
    __k = std::__detail::
          _Node_const_iterator<std::pair<const_Symbol,_std::shared_ptr<Member>_>,_false,_true>::
          operator*(&__end1);
    std::shared_ptr<Member>::shared_ptr
              ((shared_ptr<Member> *)
               &function.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &__k->second);
    std::dynamic_pointer_cast<Function,Member>((shared_ptr<Member> *)local_58);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
    if (bVar1) {
      std::__shared_ptr_access<Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_58
                );
      make<Function,Function&>((Function *)local_68);
      pmVar2 = std::
               unordered_map<Symbol,_std::shared_ptr<Member>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>_>
               ::operator[](&this->symbols,&__k->first);
      std::shared_ptr<Member>::operator=(pmVar2,(shared_ptr<Function> *)local_68);
      std::shared_ptr<Function>::~shared_ptr((shared_ptr<Function> *)local_68);
    }
    else {
      pmVar2 = std::
               unordered_map<Symbol,_std::shared_ptr<Member>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>_>
               ::operator[](&this->symbols,&__k->first);
      std::shared_ptr<Member>::operator=
                (pmVar2,(shared_ptr<Member> *)
                        &function.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    }
    std::shared_ptr<Function>::~shared_ptr((shared_ptr<Function> *)local_58);
    std::shared_ptr<Member>::~shared_ptr
              ((shared_ptr<Member> *)
               &function.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__detail::
    _Node_const_iterator<std::pair<const_Symbol,_std::shared_ptr<Member>_>,_false,_true>::operator++
              (&__end1);
  }
  return;
}

Assistant:

Environment::Environment(const Environment &other) {
    for(const auto& it : other.symbols) {
        ptr<Member> member = it.second;
        ptr<Function> function = std::dynamic_pointer_cast<Function>(member);
        if(function) {
            symbols[it.first] = make<Function>(*function);
        } else {
            symbols[it.first] = member;
        }
    }
}